

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qjsoncbor.cpp
# Opt level: O0

QString * encodeByteArray(QCborContainerPrivate *d,qsizetype idx,QCborTag encoding)

{
  long lVar1;
  bool bVar2;
  ByteData *this;
  QCborTag in_RCX;
  QString *in_RDI;
  long in_FS_OFFSET;
  QFlagsStorage<QByteArray::Base64Option> in_stack_0000000c;
  ByteData *b;
  QByteArray data;
  undefined4 in_stack_ffffffffffffff28;
  Base64Option in_stack_ffffffffffffff2c;
  enum_type in_stack_ffffffffffffff30;
  enum_type in_stack_ffffffffffffff34;
  undefined6 in_stack_ffffffffffffff38;
  undefined1 in_stack_ffffffffffffff3e;
  undefined1 in_stack_ffffffffffffff3f;
  undefined4 in_stack_ffffffffffffff50;
  undefined4 in_stack_ffffffffffffff54;
  char *in_stack_ffffffffffffff58;
  char in_stack_ffffffffffffff97;
  QByteArray *in_stack_ffffffffffffff98;
  QByteArray *in_stack_fffffffffffffff0;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  this = QCborContainerPrivate::byteData
                   ((QCborContainerPrivate *)
                    CONCAT17(in_stack_ffffffffffffff3f,
                             CONCAT16(in_stack_ffffffffffffff3e,in_stack_ffffffffffffff38)),
                    CONCAT44(in_stack_ffffffffffffff34,in_stack_ffffffffffffff30));
  if (this == (ByteData *)0x0) {
    QString::QString((QString *)0x48ccff);
  }
  else {
    QtCbor::ByteData::byte(this);
    QByteArray::fromRawData
              (in_stack_ffffffffffffff58,
               CONCAT44(in_stack_ffffffffffffff54,in_stack_ffffffffffffff50));
    bVar2 = operator==(in_RCX,ExpectedBase16);
    if (bVar2) {
      QByteArray::toHex(in_stack_ffffffffffffff98,in_stack_ffffffffffffff97);
      QByteArray::operator=
                ((QByteArray *)CONCAT44(in_stack_ffffffffffffff34,in_stack_ffffffffffffff30),
                 (QByteArray *)CONCAT44(in_stack_ffffffffffffff2c,in_stack_ffffffffffffff28));
      QByteArray::~QByteArray((QByteArray *)0x48cda1);
    }
    else {
      bVar2 = operator==(in_RCX,ExpectedBase64);
      if (bVar2) {
        QFlags<QByteArray::Base64Option>::QFlags
                  ((QFlags<QByteArray::Base64Option> *)
                   CONCAT44(in_stack_ffffffffffffff34,in_stack_ffffffffffffff30),
                   in_stack_ffffffffffffff2c);
        QByteArray::toBase64(in_stack_fffffffffffffff0,(Base64Options)in_stack_0000000c.i);
        QByteArray::operator=
                  ((QByteArray *)CONCAT44(in_stack_ffffffffffffff34,in_stack_ffffffffffffff30),
                   (QByteArray *)CONCAT44(in_stack_ffffffffffffff2c,in_stack_ffffffffffffff28));
        QByteArray::~QByteArray((QByteArray *)0x48ce32);
      }
      else {
        operator|(in_stack_ffffffffffffff34,in_stack_ffffffffffffff30);
        QByteArray::toBase64(in_stack_fffffffffffffff0,(Base64Options)in_stack_0000000c.i);
        QByteArray::operator=
                  ((QByteArray *)CONCAT44(in_stack_ffffffffffffff34,in_stack_ffffffffffffff30),
                   (QByteArray *)CONCAT44(in_stack_ffffffffffffff2c,in_stack_ffffffffffffff28));
        QByteArray::~QByteArray((QByteArray *)0x48ce7b);
      }
    }
    QString::fromLatin1<void>
              ((QByteArray *)CONCAT44(in_stack_ffffffffffffff34,in_stack_ffffffffffffff30));
    QByteArray::~QByteArray((QByteArray *)0x48ce9e);
  }
  if (*(long *)(in_FS_OFFSET + 0x28) != lVar1) {
    __stack_chk_fail();
  }
  return in_RDI;
}

Assistant:

static QString encodeByteArray(const QCborContainerPrivate *d, qsizetype idx, QCborTag encoding)
{
    const ByteData *b = d->byteData(idx);
    if (!b)
        return QString();

    QByteArray data = QByteArray::fromRawData(b->byte(), b->len);
    if (encoding == QCborKnownTags::ExpectedBase16)
        data = data.toHex();
    else if (encoding == QCborKnownTags::ExpectedBase64)
        data = data.toBase64();
    else
        data = data.toBase64(QByteArray::Base64UrlEncoding | QByteArray::OmitTrailingEquals);

    return QString::fromLatin1(data);
}